

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ConstraintItemSyntax * __thiscall
slang::parsing::Parser::parseConstraintItem(Parser *this,bool allowBlock,bool isTopLevel)

{
  bool bVar1;
  TokenKind TVar2;
  SourceLocation SVar3;
  ConstraintItemSyntax *constraints;
  ElseConstraintClauseSyntax *elseClause;
  ConditionalConstraintSyntax *pCVar4;
  RangeListSyntax *ranges;
  UniquenessConstraintSyntax *pUVar5;
  ForeachLoopListSyntax *loopList;
  LoopConstraintSyntax *pLVar6;
  DisableConstraintSyntax *pDVar7;
  ConstraintItemSyntax *pCVar8;
  ImplicationConstraintSyntax *pIVar9;
  pointer pTVar10;
  ConstraintBlockSyntax *pCVar11;
  ExpressionConstraintSyntax *pEVar12;
  ExpressionSyntax *pEVar13;
  SolveBeforeConstraintSyntax *pSVar14;
  Info *pIVar15;
  Info *extraout_RDX;
  Info *pIVar16;
  EVP_PKEY_CTX *src;
  TokenKind TVar17;
  ulong uVar18;
  EVP_PKEY_CTX *ctx;
  TokenKind TVar19;
  Token TVar20;
  SourceRange range;
  Token TVar21;
  Token elseKeyword;
  Token TVar22;
  Token local_218;
  Token semi;
  Token solve;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> afterBuffer;
  Token current_1;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> beforeBuffer;
  Token local_40;
  
  TVar20 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar20.kind;
  if (TVar2 == OpenBrace) {
    if (allowBlock) {
      beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)CONCAT44(beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_.
                             _4_4_,1);
      TVar20 = ParserBase::peek(&this->super_ParserBase,1);
      if ((TVar20.kind == CloseBrace) ||
         (bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInConcatenationExpr>
                            (this,(uint32_t *)&beforeBuffer,OpenBrace,CloseBrace), !bVar1)) {
        pCVar11 = parseConstraintBlock(this,false);
        return &pCVar11->super_ConstraintItemSyntax;
      }
    }
LAB_003702af:
    TVar20 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar20.kind);
    if (bVar1 || allowBlock) {
      TVar20 = ParserBase::peek(&this->super_ParserBase);
      pEVar13 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x84,0);
      if ((allowBlock) ||
         (TVar22 = ParserBase::peek(&this->super_ParserBase),
         TVar20.kind != TVar22.kind || TVar20.info != TVar22.info)) {
        bVar1 = ParserBase::peek(&this->super_ParserBase,MinusArrow);
        if (bVar1) {
          TVar20 = ParserBase::consume(&this->super_ParserBase);
          pCVar8 = parseConstraintItem(this,true,false);
          pIVar9 = slang::syntax::SyntaxFactory::implicationConstraint
                             (&this->factory,pEVar13,TVar20,pCVar8);
          return &pIVar9->super_ConstraintItemSyntax;
        }
        Token::Token(&local_40);
        TVar20 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pEVar12 = slang::syntax::SyntaxFactory::expressionConstraint
                            (&this->factory,local_40,pEVar13,TVar20);
        return &pEVar12->super_ConstraintItemSyntax;
      }
    }
    return (ConstraintItemSyntax *)0x0;
  }
  if (TVar2 == DisableKeyword) {
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    TVar22 = ParserBase::expect(&this->super_ParserBase,SoftKeyword);
    pEVar13 = parseExpression(this);
    TVar21 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar7 = slang::syntax::SyntaxFactory::disableConstraint
                       (&this->factory,TVar20,TVar22,pEVar13,TVar21);
    return &pDVar7->super_ConstraintItemSyntax;
  }
  if (TVar2 == ForeachKeyword) {
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    loopList = parseForeachLoopVariables(this);
    pCVar8 = parseConstraintItem(this,true,false);
    pLVar6 = slang::syntax::SyntaxFactory::loopConstraint(&this->factory,TVar20,loopList,pCVar8);
    return &pLVar6->super_ConstraintItemSyntax;
  }
  if (TVar2 == IfKeyword) {
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    TVar22 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    pEVar13 = parseExpression(this);
    TVar21 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    elseClause = (ElseConstraintClauseSyntax *)0x0;
    pCVar8 = parseConstraintItem(this,true,false);
    bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
    if (bVar1) {
      elseKeyword = ParserBase::consume(&this->super_ParserBase);
      constraints = parseConstraintItem(this,true,false);
      elseClause = slang::syntax::SyntaxFactory::elseConstraintClause
                             (&this->factory,elseKeyword,constraints);
    }
    pCVar4 = slang::syntax::SyntaxFactory::conditionalConstraint
                       (&this->factory,TVar20,TVar22,pEVar13,TVar21,pCVar8,elseClause);
    return &pCVar4->super_ConstraintItemSyntax;
  }
  if (TVar2 == SoftKeyword) {
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    pEVar13 = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    TVar22 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pEVar12 = slang::syntax::SyntaxFactory::expressionConstraint
                        (&this->factory,TVar20,pEVar13,TVar22);
    return &pEVar12->super_ConstraintItemSyntax;
  }
  if (TVar2 == UniqueKeyword) {
    TVar20 = ParserBase::consume(&this->super_ParserBase);
    ranges = parseRangeList(this);
    TVar22 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pUVar5 = slang::syntax::SyntaxFactory::uniquenessConstraint(&this->factory,TVar20,ranges,TVar22)
    ;
    return &pUVar5->super_ConstraintItemSyntax;
  }
  if (TVar2 != SolveKeyword) goto LAB_003702af;
  solve = ParserBase::consume(&this->super_ParserBase);
  if (!isTopLevel) {
    range = Token::range(&solve);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa20005,range);
  }
  Token::Token(&local_218);
  beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar20 = ParserBase::peek(&this->super_ParserBase);
  current = TVar20;
  bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar20.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
    local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar20.kind);
    if (bVar1) {
      do {
        do {
          pIVar16 = TVar20.info;
          pTVar10 = (pointer)parseExpression(this);
          afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = pTVar10;
          afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               CONCAT71(afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap._1_7_,1)
          ;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&afterBuffer);
          TVar22 = ParserBase::peek(&this->super_ParserBase);
          TVar19 = TVar22.kind;
          bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar19);
          if (TVar19 == EndOfFile || bVar1) goto LAB_003705ec;
          if (TVar19 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
                goto LAB_00370601;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
               ParserBase::expect(&this->super_ParserBase,Comma);
          afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap =
               afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap &
               0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&afterBuffer);
          TVar22 = ParserBase::peek(&this->super_ParserBase);
          pIVar15 = TVar22.info;
          TVar19 = TVar22.kind;
          bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar19);
          if (TVar19 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            goto LAB_003705ec;
          }
          TVar17 = TVar20.kind;
          uVar18 = TVar22._0_8_ & 0xffffffff;
          TVar20.info = pIVar15;
          TVar20.kind = (short)uVar18;
          TVar20._2_1_ = (char)(uVar18 >> 0x10);
          TVar20.numFlags.raw = (char)(uVar18 >> 0x18);
          TVar20.rawLen = (int)(uVar18 >> 0x20);
        } while (pIVar16 != pIVar15 || TVar17 != TVar19);
        bVar1 = ParserBase::
                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                          (&this->super_ParserBase,(DiagCode)0x10001,true);
        uVar18 = TVar22._0_8_ & 0xffffffff;
        TVar20.kind = (short)uVar18;
        TVar20._2_1_ = (char)(uVar18 >> 0x10);
        TVar20.numFlags.raw = (char)(uVar18 >> 0x18);
        TVar20.rawLen = (int)(uVar18 >> 0x20);
      } while (bVar1);
LAB_003705ec:
      local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar20,BeforeKeyword,&local_218,(DiagCode)0x10001);
    }
  }
LAB_00370601:
  Token::Token(&semi);
  afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  TVar22 = ParserBase::peek(&this->super_ParserBase);
  current_1 = TVar22;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar22.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&current_1);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar22.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar22,Semicolon,&semi,(DiagCode)0x10001);
      pIVar16 = extraout_RDX;
      goto LAB_003707a3;
    }
    do {
      do {
        pIVar16 = TVar22.info;
        pEVar13 = parseExpression(this);
        current._0_8_ = pEVar13;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&current);
        TVar20 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar20.kind);
        if (TVar20.kind != Comma || bVar1) goto LAB_0037078e;
        current = ParserBase::expect(&this->super_ParserBase,Comma);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&current);
        TVar20 = ParserBase::peek(&this->super_ParserBase);
        pIVar15 = TVar20.info;
        TVar19 = TVar20.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar19);
        if (TVar19 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_0037078e;
        }
        TVar17 = TVar22.kind;
        uVar18 = TVar20._0_8_ & 0xffffffff;
        TVar22.info = pIVar15;
        TVar22.kind = (short)uVar18;
        TVar22._2_1_ = (char)(uVar18 >> 0x10);
        TVar22.numFlags.raw = (char)(uVar18 >> 0x18);
        TVar22.rawLen = (int)(uVar18 >> 0x20);
      } while (pIVar16 != pIVar15 || TVar17 != TVar19);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x10001,true);
      uVar18 = TVar20._0_8_ & 0xffffffff;
      TVar22.kind = (short)uVar18;
      TVar22._2_1_ = (char)(uVar18 >> 0x10);
      TVar22.numFlags.raw = (char)(uVar18 >> 0x18);
      TVar22.rawLen = (int)(uVar18 >> 0x20);
    } while (bVar1);
  }
LAB_0037078e:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar16 = semi.info;
LAB_003707a3:
  TVar22 = solve;
  ctx = (EVP_PKEY_CTX *)solve._0_8_;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar16);
  TVar20 = local_218;
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_005a31e8;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  current_1.info._0_4_ = 3;
  current_1._0_8_ = &PTR_getChild_005a31e8;
  pSVar14 = slang::syntax::SyntaxFactory::solveBeforeConstraint
                      (&this->factory,TVar22,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&current,TVar20,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&current_1,semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&afterBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,ctx);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&beforeBuffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,ctx);
  return &pSVar14->super_ConstraintItemSyntax;
}

Assistant:

ConstraintItemSyntax* Parser::parseConstraintItem(bool allowBlock, bool isTopLevel) {
    switch (peek().kind) {
        case TokenKind::SolveKeyword: {
            auto solve = consume();
            if (!isTopLevel)
                addDiag(diag::SolveBeforeDisallowed, solve.range());

            Token before;
            SmallVector<TokenOrSyntax, 4> beforeBuffer;
            parseList<isPossibleExpressionOrComma, isBeforeOrSemicolon>(
                beforeBuffer, TokenKind::BeforeKeyword, TokenKind::Comma, before,
                RequireItems::True, diag::ExpectedExpression,
                [this] { return &parseExpression(); });

            Token semi;
            SmallVector<TokenOrSyntax, 4> afterBuffer;
            parseList<isPossibleExpressionOrComma, isSemicolon>(
                afterBuffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });

            return &factory.solveBeforeConstraint(solve, beforeBuffer.copy(alloc), before,
                                                  afterBuffer.copy(alloc), semi);
        }
        case TokenKind::DisableKeyword: {
            auto disable = consume();
            auto soft = expect(TokenKind::SoftKeyword);
            auto& name = parseExpression();
            return &factory.disableConstraint(disable, soft, name, expect(TokenKind::Semicolon));
        }
        case TokenKind::ForeachKeyword: {
            auto keyword = consume();
            auto& vars = parseForeachLoopVariables();
            return &factory.loopConstraint(keyword, vars, *parseConstraintItem(true, false));
        }
        case TokenKind::IfKeyword: {
            auto ifKeyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& constraints = *parseConstraintItem(true, false);

            ElseConstraintClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                elseClause = &factory.elseConstraintClause(elseKeyword,
                                                           *parseConstraintItem(true, false));
            }
            return &factory.conditionalConstraint(ifKeyword, openParen, condition, closeParen,
                                                  constraints, elseClause);
        }
        case TokenKind::UniqueKeyword: {
            auto keyword = consume();
            auto& list = parseRangeList();
            return &factory.uniquenessConstraint(keyword, list, expect(TokenKind::Semicolon));
        }
        case TokenKind::SoftKeyword: {
            auto soft = consume();
            auto& exprOrDist = parseExpressionOrDist();
            return &factory.expressionConstraint(soft, exprOrDist, expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenBrace: {
            // Ambiguity here: an open brace could either be the start of a constraint block
            // or the start of a concatenation expression. Descend into the expression until
            // we can find out for sure one way or the other.
            if (allowBlock) {
                uint32_t index = 1;
                if (peek(1).kind == TokenKind::CloseBrace ||
                    !scanTypePart<isNotInConcatenationExpr>(index, TokenKind::OpenBrace,
                                                            TokenKind::CloseBrace)) {
                    return &parseConstraintBlock(false);
                }
            }
            break;
        }
        default:
            break;
    }

    // If we reach this point we have some invalid syntax here. If we're in a nested
    // constraint block (identified by allowBlock == true) then we should make up
    // an item and return. This is accomplished by falling through to the parseSubExpression below.
    // Otherwise, this is the top level and we should return nullptr so that we skip over
    // the offending token.
    if (!isPossibleExpression(peek().kind) && !allowBlock)
        return nullptr;

    // at this point we either have an expression with optional distribution or
    // we have an implication constraint
    Token curr = peek();
    auto expr =
        &parseSubExpression(ExpressionOptions::ConstraintContext | ExpressionOptions::AllowDist, 0);
    if (!allowBlock && curr == peek())
        return nullptr;

    if (peek(TokenKind::MinusArrow)) {
        auto arrow = consume();
        return &factory.implicationConstraint(*expr, arrow, *parseConstraintItem(true, false));
    }

    return &factory.expressionConstraint(Token(), *expr, expect(TokenKind::Semicolon));
}